

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O1

void __thiscall
capnp::compiler::CompilerMain::addCompileOptions(CompilerMain *this,MainBuilder *builder)

{
  StringPtr helpText;
  StringPtr helpText_00;
  Iface *pIVar1;
  Iface *pIVar2;
  MainBuilder *pMVar3;
  initializer_list<kj::MainBuilder::OptionName> names;
  initializer_list<kj::MainBuilder::OptionName> names_00;
  StringPtr title;
  StringPtr argumentTitle;
  StringPtr argumentTitle_00;
  Function<kj::MainBuilder::Validity_()> local_a8;
  Function<kj::MainBuilder::Validity_(kj::StringPtr)> local_98;
  Function<kj::MainBuilder::Validity_(kj::StringPtr)> local_88;
  Function<kj::MainBuilder::Validity_(kj::StringPtr)> local_78;
  char *local_68;
  undefined8 uStack_60;
  OptionName local_58;
  char *local_48;
  undefined8 uStack_40;
  OptionName local_38;
  undefined1 local_28;
  char *local_20;
  
  local_38.isLong = false;
  local_38.field_1.shortName = 'o';
  local_28 = 1;
  local_20 = "output";
  local_78.impl.ptr = (Iface *)operator_new(0x18);
  (local_78.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___002ca3f0;
  local_78.impl.ptr[1]._vptr_Iface = (_func_int **)this;
  local_78.impl.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::Function<kj::MainBuilder::Validity(kj::StringPtr)>::Impl<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::addCompileOptions(kj::MainBuilder&)::{lambda(auto:1&,(auto:2&&)...)#1},capnp::compiler::CompilerMain::addCompileOptions(kj::MainBuilder&)::{lambda(auto:1&,(auto:2&&)...)#2}>>>
        ::instance;
  local_48 = 
  "Generate source code for language <lang> in directory <dir> (default: current directory).  <lang> actually specifies a plugin to use.  If <lang> is a simple word, the compiler searches for a plugin called \'capnpc-<lang>\' in $PATH.  If <lang> is a file path containing slashes, it is interpreted as the exact plugin executable file name, and $PATH is not searched.  If <lang> is \'-\', the compiler dumps the request to standard output."
  ;
  uStack_40 = 0x1b2;
  helpText.content.size_ = 0x1b2;
  helpText.content.ptr =
       "Generate source code for language <lang> in directory <dir> (default: current directory).  <lang> actually specifies a plugin to use.  If <lang> is a simple word, the compiler searches for a plugin called \'capnpc-<lang>\' in $PATH.  If <lang> is a file path containing slashes, it is interpreted as the exact plugin executable file name, and $PATH is not searched.  If <lang> is \'-\', the compiler dumps the request to standard output."
  ;
  names._M_len = 2;
  names._M_array = &local_38;
  argumentTitle.content.size_ = 0xf;
  argumentTitle.content.ptr = "<lang>[:<dir>]";
  pMVar3 = kj::MainBuilder::addOptionWithArg(builder,names,&local_78,argumentTitle,helpText);
  local_58.isLong = true;
  local_58.field_1.longName = "src-prefix";
  local_88.impl.ptr = (Iface *)operator_new(0x18);
  (local_88.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___002ca458;
  local_88.impl.ptr[1]._vptr_Iface = (_func_int **)this;
  local_88.impl.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::Function<kj::MainBuilder::Validity(kj::StringPtr)>::Impl<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::addCompileOptions(kj::MainBuilder&)::{lambda(auto:1&,(auto:2&&)...)#3},capnp::compiler::CompilerMain::addCompileOptions(kj::MainBuilder&)::{lambda(auto:1&,(auto:2&&)...)#4}>>>
        ::instance;
  local_68 = 
  "If a file specified for compilation starts with <prefix>, remove the prefix for the purpose of deciding the names of output files.  For example, the following command:\n    capnp compile --src-prefix=foo/bar -oc++:corge foo/bar/baz/qux.capnp\nwould generate the files corge/baz/qux.capnp.{h,c++}."
  ;
  uStack_60 = 0x127;
  helpText_00.content.size_ = 0x127;
  helpText_00.content.ptr =
       "If a file specified for compilation starts with <prefix>, remove the prefix for the purpose of deciding the names of output files.  For example, the following command:\n    capnp compile --src-prefix=foo/bar -oc++:corge foo/bar/baz/qux.capnp\nwould generate the files corge/baz/qux.capnp.{h,c++}."
  ;
  names_00._M_len = 1;
  names_00._M_array = &local_58;
  argumentTitle_00.content.size_ = 9;
  argumentTitle_00.content.ptr = "<prefix>";
  pMVar3 = kj::MainBuilder::addOptionWithArg(pMVar3,names_00,&local_88,argumentTitle_00,helpText_00)
  ;
  local_98.impl.ptr = (Iface *)operator_new(0x18);
  (local_98.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___002ca4c0;
  local_98.impl.ptr[1]._vptr_Iface = (_func_int **)this;
  local_98.impl.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::Function<kj::MainBuilder::Validity(kj::StringPtr)>::Impl<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::addCompileOptions(kj::MainBuilder&)::{lambda(auto:1&,(auto:2&&)...)#5},capnp::compiler::CompilerMain::addCompileOptions(kj::MainBuilder&)::{lambda(auto:1&,(auto:2&&)...)#6}>>>
        ::instance;
  title.content.size_ = 9;
  title.content.ptr = "<source>";
  pMVar3 = kj::MainBuilder::expectOneOrMoreArgs(pMVar3,title,&local_98);
  local_a8.impl.ptr = (Iface *)operator_new(0x18);
  (local_a8.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___002ca580;
  local_a8.impl.ptr[1]._vptr_Iface = (_func_int **)this;
  local_a8.impl.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::Function<kj::MainBuilder::Validity()>::Impl<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::addCompileOptions(kj::MainBuilder&)::{lambda(auto:1&,(auto:2&&)...)#7},capnp::compiler::CompilerMain::addCompileOptions(kj::MainBuilder&)::{lambda(auto:1&,(auto:2&&)...)#8}>>>
        ::instance;
  kj::MainBuilder::callAfterParsing(pMVar3,&local_a8);
  pIVar1 = local_a8.impl.ptr;
  if (local_a8.impl.ptr != (Iface *)0x0) {
    local_a8.impl.ptr = (Iface *)0x0;
    (**(local_a8.impl.disposer)->_vptr_Disposer)
              (local_a8.impl.disposer,pIVar1->_vptr_Iface[-2] + (long)&pIVar1->_vptr_Iface);
  }
  pIVar2 = local_98.impl.ptr;
  if (local_98.impl.ptr != (Iface *)0x0) {
    local_98.impl.ptr = (Iface *)0x0;
    (**(local_98.impl.disposer)->_vptr_Disposer)
              (local_98.impl.disposer,pIVar2->_vptr_Iface[-2] + (long)&pIVar2->_vptr_Iface);
  }
  pIVar2 = local_88.impl.ptr;
  if (local_88.impl.ptr != (Iface *)0x0) {
    local_88.impl.ptr = (Iface *)0x0;
    (**(local_88.impl.disposer)->_vptr_Disposer)
              (local_88.impl.disposer,pIVar2->_vptr_Iface[-2] + (long)&pIVar2->_vptr_Iface);
  }
  pIVar2 = local_78.impl.ptr;
  if (local_78.impl.ptr != (Iface *)0x0) {
    local_78.impl.ptr = (Iface *)0x0;
    (**(local_78.impl.disposer)->_vptr_Disposer)
              (local_78.impl.disposer,pIVar2->_vptr_Iface[-2] + (long)&pIVar2->_vptr_Iface);
  }
  return;
}

Assistant:

void addCompileOptions(kj::MainBuilder& builder) {
    builder.addOptionWithArg({'o', "output"}, KJ_BIND_METHOD(*this, addOutput), "<lang>[:<dir>]",
                             "Generate source code for language <lang> in directory <dir> "
                             "(default: current directory).  <lang> actually specifies a plugin "
                             "to use.  If <lang> is a simple word, the compiler searches for a plugin "
                             "called 'capnpc-<lang>' in $PATH.  If <lang> is a file path "
                             "containing slashes, it is interpreted as the exact plugin "
                             "executable file name, and $PATH is not searched.  If <lang> is '-', "
                             "the compiler dumps the request to standard output.")
           .addOptionWithArg({"src-prefix"}, KJ_BIND_METHOD(*this, addSourcePrefix), "<prefix>",
                             "If a file specified for compilation starts with <prefix>, remove "
                             "the prefix for the purpose of deciding the names of output files.  "
                             "For example, the following command:\n"
                             "    capnp compile --src-prefix=foo/bar -oc++:corge foo/bar/baz/qux.capnp\n"
                             "would generate the files corge/baz/qux.capnp.{h,c++}.")
           .expectOneOrMoreArgs("<source>", KJ_BIND_METHOD(*this, addSource))
           .callAfterParsing(KJ_BIND_METHOD(*this, generateOutput));
  }